

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeWriter.cpp
# Opt level: O0

bool __thiscall
Js::ByteCodeWriter::TryWriteArgNoSrc<Js::LayoutSizePolicy<(Js::LayoutSize)1>>
          (ByteCodeWriter *this,OpCode op,ArgSlot arg)

{
  bool bVar1;
  uchar local_1d;
  ArgSlot local_1c;
  OpCode local_1a;
  OpLayoutT_ArgNoSrc<Js::LayoutSizePolicy<(Js::LayoutSize)1>_> layout;
  ArgSlot arg_local;
  ByteCodeWriter *pBStack_18;
  OpCode op_local;
  ByteCodeWriter *this_local;
  
  local_1c = arg;
  local_1a = op;
  pBStack_18 = this;
  bVar1 = LayoutSizePolicy<(Js::LayoutSize)1>::Assign<unsigned_char,unsigned_short>(&local_1d,arg);
  if (bVar1) {
    Data::EncodeT<(Js::LayoutSize)1>(&this->m_byteCodeData,local_1a,&local_1d,1,this);
  }
  return bVar1;
}

Assistant:

bool ByteCodeWriter::TryWriteArgNoSrc(OpCode op, ArgSlot arg)
    {
        OpLayoutT_ArgNoSrc<SizePolicy> layout;
        if (SizePolicy::Assign(layout.Arg, arg))
        {
            m_byteCodeData.EncodeT<SizePolicy::LayoutEnum>(op, &layout, sizeof(layout), this);
            return true;
        }
        return false;
    }